

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_ExtensionDeclarationMissingFullNameOrType_Test::
~ValidationErrorTest_ExtensionDeclarationMissingFullNameOrType_Test
          (ValidationErrorTest_ExtensionDeclarationMissingFullNameOrType_Test *this)

{
  ValidationErrorTest_ExtensionDeclarationMissingFullNameOrType_Test *this_local;
  
  ~ValidationErrorTest_ExtensionDeclarationMissingFullNameOrType_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionDeclarationMissingFullNameOrType) {
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          extension_range {
            start: 10
            end: 11
            options: { declaration: { number: 10 full_name: ".foo.Bar.foo" } }
          }
          extension_range {
            start: 11
            end: 12
            options: { declaration: { number: 11 type: ".Baz" } }
          }
        }
      )pb",
      "foo.proto: Foo: EXTENDEE: Extension declaration #10 should have both"
      " \"full_name\" and \"type\" set.\n"
      "foo.proto: Foo: EXTENDEE: Extension declaration #11 should have both"
      " \"full_name\" and \"type\" set.\n");
}